

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

bool __thiscall Wasm::PolymorphicEmitInfo::IsUnreachable(PolymorphicEmitInfo *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = this->count;
  if (uVar1 == 0) {
    return false;
  }
  if (uVar1 == 1) {
    bVar5 = (this->field_1).singleInfo.type == Any;
  }
  else {
    bVar5 = uVar1 != 0;
    if (bVar5) {
      if (((this->field_1).infos)->type != Any) {
        lVar4 = 0;
        do {
          iVar3 = (int)lVar4;
          if (uVar1 - 1 == iVar3) break;
          lVar2 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while ((this->field_1).infos[lVar2].type != Any);
        bVar5 = iVar3 + 1U < uVar1;
      }
      return bVar5;
    }
  }
  return bVar5;
}

Assistant:

bool PolymorphicEmitInfo::IsUnreachable() const
{
    if (count == 0)
    {
        return false;
    }
    if (count == 1)
    {
        return singleInfo.type == WasmTypes::Any;
    }
    for (uint32 i = 0; i < count; ++i)
    {
        if (infos[i].type == WasmTypes::Any)
        {
            return true;
        }
    }
    return false;
}